

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 anon_unknown.dwarf_1f0a16::InferPubkey
           (CPubKey *pubkey,ParseScriptContext ctx,SigningProvider *provider)

{
  bool bVar1;
  byte bVar2;
  long *in_RCX;
  int in_EDX;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *in_RSI;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> in_RDI;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_provider;
  KeyOriginInfo info;
  KeyOriginInfo *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  CPubKey *in_stack_ffffffffffffff48;
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  *this;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  KeyOriginInfo *__args_1;
  uint in_stack_ffffffffffffff98;
  unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
  local_50 [2];
  undefined1 local_40 [36];
  undefined1 local_1c [20];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __args_1 = (KeyOriginInfo *)in_RDI._M_head_impl;
  bVar1 = CPubKey::IsValidNonHybrid(in_stack_ffffffffffffff48);
  if (bVar1) {
    if ((in_EDX != 0) && (in_EDX != 1)) {
      bVar1 = CPubKey::IsCompressed((CPubKey *)in_stack_ffffffffffffff38);
      if (!bVar1) {
        std::
        unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
        ::unique_ptr<std::default_delete<(anonymous_namespace)::PubkeyProvider>,void>
                  ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)in_stack_ffffffffffffff38,(nullptr_t)0x248993);
        goto LAB_00248af3;
      }
    }
    this = local_50;
    std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,int,CPubKey_const&,bool>
              (in_stack_ffffffffffffff70,
               (CPubKey *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (bool *)in_RDI._M_head_impl);
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
    ::
    unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>,void>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)this,(unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                        *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::
    unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
    ::~unique_ptr(this);
    KeyOriginInfo::KeyOriginInfo(in_stack_ffffffffffffff38);
    CPubKey::GetID((CPubKey *)in_RDI._M_head_impl);
    bVar2 = (**(code **)(*in_RCX + 0x38))(in_RCX,local_1c,local_40);
    if ((bVar2 & 1) == 0) {
      std::
      unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
      ::unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)in_stack_ffffffffffffff38,
                   (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)0x248ad1);
    }
    else {
      std::
      make_unique<(anonymous_namespace)::OriginPubkeyProvider,int,KeyOriginInfo,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool>
                ((int *)(ulong)(in_stack_ffffffffffffff98 & 0xffffff),__args_1,in_RSI,
                 (bool *)CONCAT44(in_EDX,in_stack_ffffffffffffff80));
      std::
      unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
      ::
      unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>,void>
                ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)this,(unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                          *)CONCAT17(bVar2,in_stack_ffffffffffffff40));
      std::
      unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                     *)this);
    }
    KeyOriginInfo::~KeyOriginInfo(in_stack_ffffffffffffff38);
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)this);
  }
  else {
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>
    ::unique_ptr<std::default_delete<(anonymous_namespace)::PubkeyProvider>,void>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)in_stack_ffffffffffffff38,(nullptr_t)0x248964);
  }
LAB_00248af3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              )in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferPubkey(const CPubKey& pubkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    // Key cannot be hybrid
    if (!pubkey.IsValidNonHybrid()) {
        return nullptr;
    }
    // Uncompressed is only allowed in TOP and P2SH contexts
    if (ctx != ParseScriptContext::TOP && ctx != ParseScriptContext::P2SH && !pubkey.IsCompressed()) {
        return nullptr;
    }
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, false);
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(pubkey.GetID(), info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}